

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makewff.c
# Opt level: O1

void generate_wff(void)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int cl [1000];
  uint local_fd8 [1002];
  
  if (style == 2) {
    printf("%d %d\n",(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  else if (style == 0) {
    printf("c seed= %u\np cnf %d %d\n",(ulong)seed,(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  if (0 < nclauses) {
    iVar6 = 1;
    do {
      if (0 < clen) {
        lVar4 = 0;
LAB_00101395:
        do {
          lVar2 = random();
          uVar3 = (int)(lVar2 % (long)nvars) + 1;
          if (lVar4 != 0) {
            lVar2 = 0;
            bVar1 = false;
            do {
              if (uVar3 == local_fd8[lVar2]) {
                bVar1 = true;
              }
              lVar2 = lVar2 + 1;
            } while (lVar4 != lVar2);
            if (bVar1) goto LAB_00101395;
          }
          local_fd8[lVar4] = uVar3;
          lVar4 = lVar4 + 1;
        } while (lVar4 < clen);
      }
      if (clen < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          lVar4 = random();
          if (499 < lVar4 % 1000) {
            local_fd8[uVar5] = -local_fd8[uVar5];
          }
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)clen);
      }
      if (style == 2) {
        printf("%d",uVar5 & 0xffffffff);
        if (0 < clen) {
          lVar4 = 0;
          do {
            printf(" %d",(ulong)local_fd8[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 < clen);
        }
LAB_001014f4:
        putchar(10);
      }
      else {
        if (style == 1) {
          printf("%d",(ulong)local_fd8[0]);
          if (1 < clen) {
            lVar4 = 1;
            do {
              printf(" %d",(ulong)local_fd8[lVar4]);
              lVar4 = lVar4 + 1;
            } while (lVar4 < clen);
          }
          goto LAB_001014f4;
        }
        if (style == 0) {
          if (0 < clen) {
            lVar4 = 0;
            do {
              printf("%d ",(ulong)local_fd8[lVar4]);
              lVar4 = lVar4 + 1;
            } while (lVar4 < clen);
          }
          puts("0");
        }
      }
      bVar1 = iVar6 < nclauses;
      iVar6 = iVar6 + 1;
    } while (bVar1);
  }
  if (style != 1) {
    return;
  }
  printf("%%\n0\n");
  return;
}

Assistant:

void generate_wff()
{
    int i, j, k;
    int cl[MAX_CLEN];
    int lit;
    int dup;

    if (style == CNF_style) {
        printf("c seed= %u\np cnf %d %d\n", seed, nvars, nclauses);
    } else if (style == KF_style) {
        printf("%d %d\n", nvars, nclauses);
    }

    for (i = 1; i <= nclauses; i++) {
        for (j = 0; j < clen; j++) {
            do {
                lit = random() % nvars + 1;
                dup = FALSE;
                for (k = 0; k < j; k++)
                    if (lit == cl[k])
                        dup = TRUE;
            } while (dup);
            cl[j] = lit;
        }
        for (j = 0; j < clen; j++)
            if (flip())
                cl[j] *= -1;

        if (style == CNF_style) {
            for (j = 0; j < clen; j++)
                printf("%d ", cl[j]);
            printf("0\n");
        } else if (style == F_style) {
            printf("%d", cl[0]);
            for (j = 1; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        } else if (style == KF_style) {
            printf("%d", j);
            for (j = 0; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        }
    }

    if (style == F_style) {
        printf("%%\n0\n");
    }
}